

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O2

bool __thiscall Process::Converter::setupEnd(Converter *this)

{
  bool bVar1;
  string *s;
  _Alloc_hider __x;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"rsrc/C/end.txt",(allocator<char> *)&local_40);
  bVar1 = Parsing::File::setPath(&this->_f,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    Parsing::File::getContent_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60,&this->_f);
    for (__x._M_p = local_60._M_dataplus._M_p; __x._M_p != (pointer)local_60._M_string_length;
        __x._M_p = __x._M_p + 0x20) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->_contC,(value_type *)__x._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_60);
  }
  else {
    std::operator+(&local_40,"Missing file : ",&(this->_f)._path);
    std::operator+(&local_60,&local_40," in rsrc!");
    error(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool Converter::setupEnd()
    {
        if (!_f.setPath("rsrc/C/end.txt"))
            return error("Missing file : " + _f.getPath() + " in rsrc!");

        for (const std::string &s : _f.getContent())
            _contC.push_back(s);
        return true;
    }